

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<12,_uWS::WebSocketHandshake::Sha1Loop<5>_>::operator()
          (static_for<12,_uWS::WebSocketHandshake::Sha1Loop<5>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<11,_uWS::WebSocketHandshake::Sha1Loop<5>_> local_11;
  
  static_for<11,_uWS::WebSocketHandshake::Sha1Loop<5>_>::operator()(&local_11,a,b);
  uVar1 = b[0xf] ^ b[4] ^ b[9] ^ b[7];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[7] = uVar2;
  uVar1 = a[4];
  a[1] = a[1] + (*a << 5 | *a >> 0x1b) + (a[3] ^ a[2] ^ uVar1) + uVar2 + 0xca62c1d6;
  a[4] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }